

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c-html.c
# Opt level: O1

void render_utf8_codepoint
               (MD_HTML *r,uint codepoint,_func_void_MD_HTML_ptr_MD_CHAR_ptr_MD_SIZE *fn_append)

{
  ulong uVar1;
  undefined8 in_RAX;
  MD_SIZE MVar2;
  undefined1 uVar3;
  undefined8 uStack_8;
  
  uVar3 = (undefined1)codepoint;
  uStack_8._0_4_ = (undefined4)in_RAX;
  uStack_8._5_3_ = (undefined3)((ulong)in_RAX >> 0x28);
  if (codepoint < 0x80) {
    uStack_8._0_5_ = CONCAT14(uVar3,(undefined4)uStack_8);
    MVar2 = 1;
  }
  else {
    uStack_8._6_2_ = (undefined2)((ulong)in_RAX >> 0x30);
    if (codepoint < 0x800) {
      uStack_8 = CONCAT26(uStack_8._6_2_,
                          CONCAT15(uVar3,CONCAT14((char)(codepoint >> 6),(undefined4)uStack_8))) &
                 0xffff3fffffffffff | 0x80c000000000;
      MVar2 = 2;
    }
    else if (codepoint < 0x10000) {
      uVar1 = CONCAT26(uStack_8._6_2_,
                       CONCAT15((char)(codepoint >> 6),
                                CONCAT14((char)(codepoint >> 0xc),(undefined4)uStack_8))) &
              0xffff3fffffffffff;
      uStack_8._7_1_ = (undefined1)(uVar1 >> 0x38);
      uStack_8 = CONCAT17(uStack_8._7_1_,CONCAT16(uVar3,(int6)uVar1)) & 0xff3fffffffffffff |
                 0x8080e000000000;
      MVar2 = 3;
    }
    else {
      uStack_8 = CONCAT44((codepoint << 0x18 |
                          (codepoint & 0x3fc0) << 10 |
                          codepoint >> 0x12 & 0xff | codepoint >> 4 & 0xff00) & (uint)DAT_0010e0f0 |
                          (uint)DAT_0010e100,(undefined4)uStack_8);
      MVar2 = 4;
    }
  }
  if (codepoint - 1 < 0x10ffff) {
    (*fn_append)(r,(MD_CHAR *)((long)&uStack_8 + 4),MVar2);
    return;
  }
  (*fn_append)(r,render_utf8_codepoint::utf8_replacement_char,3);
  return;
}

Assistant:

static void
render_utf8_codepoint(MD_HTML* r, unsigned codepoint,
                      void (*fn_append)(MD_HTML*, const MD_CHAR*, MD_SIZE))
{
    static const MD_CHAR utf8_replacement_char[] = { (char)0xef, (char)0xbf, (char)0xbd };

    unsigned char utf8[4];
    size_t n;

    if(codepoint <= 0x7f) {
        n = 1;
        utf8[0] = codepoint;
    } else if(codepoint <= 0x7ff) {
        n = 2;
        utf8[0] = 0xc0 | ((codepoint >>  6) & 0x1f);
        utf8[1] = 0x80 + ((codepoint >>  0) & 0x3f);
    } else if(codepoint <= 0xffff) {
        n = 3;
        utf8[0] = 0xe0 | ((codepoint >> 12) & 0xf);
        utf8[1] = 0x80 + ((codepoint >>  6) & 0x3f);
        utf8[2] = 0x80 + ((codepoint >>  0) & 0x3f);
    } else {
        n = 4;
        utf8[0] = 0xf0 | ((codepoint >> 18) & 0x7);
        utf8[1] = 0x80 + ((codepoint >> 12) & 0x3f);
        utf8[2] = 0x80 + ((codepoint >>  6) & 0x3f);
        utf8[3] = 0x80 + ((codepoint >>  0) & 0x3f);
    }

    if(0 < codepoint  &&  codepoint <= 0x10ffff)
        fn_append(r, (char*)utf8, (MD_SIZE)n);
    else
        fn_append(r, utf8_replacement_char, 3);
}